

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O1

void __thiscall UniValue::setInt(UniValue *this,uint64_t val_)

{
  string str;
  long in_FS_OFFSET;
  ostringstream oss;
  undefined1 *in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  long in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__cxx11::stringbuf::str();
  str._M_string_length = in_stack_fffffffffffffe50;
  str._M_dataplus._M_p = in_stack_fffffffffffffe48;
  str.field_2._M_allocated_capacity = in_stack_fffffffffffffe58;
  str.field_2._8_8_ = in_stack_fffffffffffffe60;
  setNumStr(this,str);
  if (in_stack_fffffffffffffe48 != &stack0xfffffffffffffe58) {
    operator_delete(in_stack_fffffffffffffe48,in_stack_fffffffffffffe58 + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void UniValue::setInt(uint64_t val_)
{
    std::ostringstream oss;

    oss << val_;

    return setNumStr(oss.str());
}